

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.h
# Opt level: O0

TanHParameter * __thiscall caffe::V1LayerParameter::mutable_tanh_param(V1LayerParameter *this)

{
  TanHParameter *this_00;
  V1LayerParameter *this_local;
  
  set_has_tanh_param(this);
  if (this->tanh_param_ == (TanHParameter *)0x0) {
    this_00 = (TanHParameter *)operator_new(0x20);
    TanHParameter::TanHParameter(this_00);
    this->tanh_param_ = this_00;
  }
  return this->tanh_param_;
}

Assistant:

inline ::caffe::TanHParameter* V1LayerParameter::mutable_tanh_param() {
  set_has_tanh_param();
  if (tanh_param_ == NULL) {
    tanh_param_ = new ::caffe::TanHParameter;
  }
  // @@protoc_insertion_point(field_mutable:caffe.V1LayerParameter.tanh_param)
  return tanh_param_;
}